

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O0

ssize_t __thiscall
pstore::repo::generic_section_creation_dispatcher::write
          (generic_section_creation_dispatcher *this,int __fd,void *__buf,size_t __n)

{
  generic_section *pgVar1;
  generic_section *this_00;
  size_t sVar2;
  undefined4 in_register_00000034;
  sources<std::pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>_>
  local_50;
  generic_section *local_20;
  generic_section *scn;
  uint8_t *out_local;
  generic_section_creation_dispatcher *this_local;
  
  scn = (generic_section *)CONCAT44(in_register_00000034,__fd);
  out_local = (uint8_t *)this;
  pgVar1 = (generic_section *)
           section_creation_dispatcher::aligned
                     (&this->super_section_creation_dispatcher,(uint8_t *)scn);
  if (pgVar1 == scn) {
    this_00 = (generic_section *)generic_section::operator_new(0x10,scn);
    section_content::make_sources(&local_50,this->section_);
    generic_section::
    generic_section<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
              (this_00,&local_50,this->section_->align);
    pgVar1 = scn;
    local_20 = this_00;
    sVar2 = generic_section::size_bytes(this_00);
    return (long)&pgVar1->field_0 + sVar2;
  }
  assert_failed("this->aligned (out) == out",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/generic_section.cpp"
                ,99);
}

Assistant:

std::uint8_t * generic_section_creation_dispatcher::write (std::uint8_t * const out) const {
            PSTORE_ASSERT (this->aligned (out) == out);
            auto * const scn =
                new (out) generic_section (section_->make_sources (), section_->align);
            return out + scn->size_bytes ();
        }